

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncEvent.cpp
# Opt level: O0

void __thiscall cali::TimedAsyncEvent::end(TimedAsyncEvent *this)

{
  SnapshotView local_c8;
  cali_variant_t local_b8;
  Variant local_a8;
  undefined1 local_98 [8];
  Entry data [2];
  Attribute local_58;
  Attribute duration_attr;
  Caliper c;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  uint64_t local_18;
  uint64_t nsec;
  TimedAsyncEvent *this_local;
  
  nsec = (uint64_t)this;
  c._24_8_ = std::chrono::_V2::steady_clock::now();
  local_28.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&c.m_is_signal,&this->start_time_);
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_28);
  local_18 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_20);
  Caliper::Caliper((Caliper *)&duration_attr);
  local_58 = anon_unknown.dwarf_2e8b98::get_event_duration_attr((Caliper *)&duration_attr);
  Entry::Entry((Entry *)local_98,this->end_tree_node_);
  local_b8 = cali_make_variant_from_uint(local_18);
  Variant::Variant(&local_a8,&local_b8);
  Entry::Entry((Entry *)&data[0].m_value.m_v.value,&local_58,&local_a8);
  SnapshotView::SnapshotView(&local_c8,2,(Entry *)local_98);
  Caliper::async_event((Caliper *)&duration_attr,local_c8);
  Caliper::~Caliper((Caliper *)&duration_attr);
  return;
}

Assistant:

void TimedAsyncEvent::end()
{
    uint64_t nsec = std::chrono::duration_cast<std::chrono::nanoseconds>(clock::now() - start_time_).count();

    Caliper c;
    Attribute duration_attr = ::get_event_duration_attr(c);
    const Entry data[2] = {
        { end_tree_node_ }, { duration_attr, cali_make_variant_from_uint(nsec) }
    };

    c.async_event(SnapshotView(2, data));
}